

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O3

void __thiscall Snes_Spc::end_frame(Snes_Spc *this,time_t end_time)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Snes_Spc *this_00;
  long lVar4;
  
  iVar2 = (this->m).spc_time;
  this_00 = this;
  if (iVar2 < end_time) {
    run_until_(this,end_time);
    iVar2 = (this->m).spc_time;
  }
  (this->m).spc_time = iVar2 - end_time;
  piVar1 = &(this->m).extra_clocks;
  *piVar1 = *piVar1 + end_time;
  lVar4 = 0x800;
  do {
    if (*(int *)((this->dsp).m.regs + lVar4) < 1) {
      run_timer_(this_00,(Timer *)((this->dsp).m.regs + lVar4),0);
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x848);
  iVar2 = (this->m).dsp_time;
  if (iVar2 < -0x1c) {
    uVar3 = 0x7fffffe3U - iVar2 & 0x7fffffe0;
    (this->m).dsp_time = iVar2 + uVar3 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar3 + 0x20);
  }
  if ((this->m).buf_begin != (sample_t_conflict1 *)0x0) {
    save_extra(this);
    return;
  }
  return;
}

Assistant:

void Snes_Spc::end_frame( time_t end_time )
{
	// Catch CPU up to as close to end as possible. If final instruction
	// would exceed end, does NOT execute it and leaves m.spc_time < end.
	if ( end_time > m.spc_time )
		run_until_( end_time );
	
	m.spc_time     -= end_time;
	m.extra_clocks += end_time;
	
	// Greatest number of clocks early that emulation can stop early due to
	// not being able to execute current instruction without going over
	// allowed time.
	assert( -cpu_lag_max <= m.spc_time && m.spc_time <= 0 );
	
	// Catch timers up to CPU
	for ( int i = 0; i < timer_count; i++ )
		run_timer( &m.timers [i], 0 );
	
	// Catch DSP up to CPU
	if ( m.dsp_time < 0 )
	{
		RUN_DSP( 0, max_reg_time );
	}
	
	// Save any extra samples beyond what should be generated
	if ( m.buf_begin )
		save_extra();
}